

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall cmGraphVizWriter::~cmGraphVizWriter(cmGraphVizWriter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor =
       (_func_int **)&PTR__cmGraphVizWriter_00965e30;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->GlobalFileStream,"}\n",2);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->NodeNames)._M_t);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&this->TargetsToIgnoreRegex);
  pcVar2 = (this->GraphNodePrefix)._M_dataplus._M_p;
  paVar1 = &(this->GraphNodePrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->GraphHeader)._M_dataplus._M_p;
  paVar1 = &(this->GraphHeader).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->GraphName)._M_dataplus._M_p;
  paVar1 = &(this->GraphName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
  ::~_Rb_tree(&(this->TargetDependersConnections)._M_t);
  std::
  _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
  ::~_Rb_tree(&(this->PerTargetConnections)._M_t);
  cmGeneratedFileStream::~cmGeneratedFileStream(&this->GlobalFileStream);
  pcVar2 = (this->FileName)._M_dataplus._M_p;
  paVar1 = &(this->FileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor =
       (_func_int **)&PTR__cmLinkItemGraphVisitor_00965e98;
  std::
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->super_cmLinkItemGraphVisitor).VisitedLinks._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->super_cmLinkItemGraphVisitor).VisitedItems._M_t);
  return;
}

Assistant:

cmGraphVizWriter::~cmGraphVizWriter()
{
  this->WriteFooter(this->GlobalFileStream);
}